

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  anon_union_280_10_9f9d5394_for_proto *ftpc;
  byte *pbVar1;
  char cVar2;
  connectdata *conn;
  FILEPROTO *pFVar3;
  curl_trc_feat *pcVar4;
  long lVar5;
  long lVar6;
  timediff_t tVar7;
  CURLcode CVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  curl_slist *pcVar13;
  curltime cVar14;
  char *rawPath;
  int ftpcode;
  ssize_t nread;
  ssize_t nread_1;
  char *local_60;
  int local_54;
  size_t local_50;
  int local_44;
  long local_40;
  ssize_t local_38;
  
  conn = data->conn;
  pFVar3 = (data->req).p.file;
  local_60 = (char *)0x0;
  local_50 = 0;
  if (pFVar3 == (FILEPROTO *)0x0) {
    return CURLE_OK;
  }
  if ((((CURLE_FILESIZE_EXCEEDED < status) ||
       ((0x80000010428e3601U >> ((ulong)status & 0x3f) & 1) == 0)) &&
      (status != CURLE_REMOTE_FILE_NOT_FOUND)) || (uVar11 = 0, premature)) {
    *(byte *)((long)&conn->proto + 0x112) = *(byte *)((long)&conn->proto + 0x112) & 0xeb | 0x10;
    Curl_conncontrol(conn,1);
    uVar11 = (ulong)status;
  }
  if (((data->state).field_0x774 & 0x40) != 0) {
    if (((data->set).chunk_end != (curl_chunk_end_callback)0x0) &&
       ((conn->proto).ftpc.file != (char *)0x0)) {
      Curl_set_in_callback(data,true);
      (*(data->set).chunk_end)((data->set).wildcardptr);
      Curl_set_in_callback(data,false);
    }
    (conn->proto).ftpc.known_filesize = -1;
  }
  ftpc = &conn->proto;
  if ((int)uVar11 == 0) {
    CVar8 = Curl_urldecode(pFVar3->path,0,&local_60,&local_50,REJECT_CTRL);
    uVar11 = (ulong)CVar8;
    if (CVar8 != CURLE_OK) goto LAB_00127f91;
    if (((data->set).ftp_filemethod == '\x02') && (*local_60 == '/')) {
      (*Curl_cfree)(local_60);
      pcVar10 = (conn->proto).ftpc.prevpath;
LAB_0012821d:
      if (((pcVar10 != (char *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"Remembering we are in dir \"%s\"");
      }
    }
    else {
      (*Curl_cfree)((conn->proto).ftpc.prevpath);
      if ((*(byte *)((long)&conn->proto + 0x112) & 0x10) == 0) {
        if ((data->set).ftp_filemethod == '\x02') {
          local_50 = 0;
        }
        else {
          pcVar10 = (conn->proto).ftpc.file;
          if (pcVar10 == (char *)0x0) {
            sVar9 = 0;
          }
          else {
            sVar9 = strlen(pcVar10);
          }
          local_50 = local_50 - sVar9;
        }
        local_60[local_50] = '\0';
        (conn->proto).ftpc.prevpath = local_60;
        pcVar10 = local_60;
        goto LAB_0012821d;
      }
      (*Curl_cfree)(local_60);
      (conn->proto).ftpc.prevpath = (char *)0x0;
    }
    freedirs(&ftpc->ftpc);
    if (conn->sock[1] != -1) {
      if ((((*(byte *)((long)&conn->proto + 0x112) & 2) == 0) || ((data->req).maxdownload < 1)) ||
         (CVar8 = Curl_pp_sendf(data,&(ftpc->ftpc).pp,"%s","ABOR"), CVar8 == CURLE_OK)) {
        close_secondarysocket(data);
        goto LAB_001282d7;
      }
      uVar11 = (ulong)CVar8;
      pcVar10 = curl_easy_strerror(CVar8);
      Curl_failf(data,"Failure sending ABOR command: %s",pcVar10);
      pbVar1 = (byte *)((long)&conn->proto + 0x112);
      *pbVar1 = *pbVar1 & 0xfb;
      Curl_conncontrol(conn,1);
      goto LAB_00127fd3;
    }
LAB_001282d7:
    if (((pFVar3->fd != 0) || ((*(byte *)((long)&conn->proto + 0x112) & 4) == 0)) ||
       (*(char *)((long)&conn->proto + 8) != '\x01' || premature)) goto LAB_001282fe;
    tVar7 = (conn->proto).ftpc.pp.response_time;
    (conn->proto).smbc.send_buf = (char *)0xea60;
    cVar14 = Curl_now();
    (conn->proto).ftpc.pp.response.tv_sec = cVar14.tv_sec;
    (conn->proto).rtspc.state = cVar14.tv_usec;
    CVar8 = Curl_GetFTPResponse(data,&local_40,&local_44);
    (conn->proto).ftpc.pp.response_time = tVar7;
    if (CVar8 == CURLE_OPERATION_TIMEDOUT && local_40 == 0) {
      Curl_failf(data,"control connection looks dead");
      pbVar1 = (byte *)((long)&conn->proto + 0x112);
      *pbVar1 = *pbVar1 & 0xfb;
      Curl_conncontrol(conn,1);
      goto LAB_0012819f;
    }
    if (CVar8 != CURLE_OK) goto LAB_0012819f;
    if ((*(byte *)((long)&conn->proto + 0x112) & 2) == 0) {
      if ((local_44 == 0xe2) || (local_44 == 0xfa)) goto LAB_001282fe;
      if (local_44 != 0x228) {
        Curl_failf(data,"server did not report OK, got %d");
        goto LAB_001284bb;
      }
      Curl_failf(data,"Exceeded storage allocation");
      uVar11 = 0x46;
    }
    else {
      if (0 < (data->req).maxdownload) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(data,"partial download completed, closing connection");
        }
        Curl_conncontrol(conn,1);
        return CURLE_OK;
      }
LAB_001282fe:
      uVar11 = 0;
      uVar12 = 0;
      if (!premature) {
        if (((data->state).field_0x776 & 2) == 0) {
          lVar5 = (data->req).size;
          if (((lVar5 == -1) || (lVar6 = (data->req).bytecount, lVar5 == lVar6)) ||
             ((data->req).maxdownload == lVar6)) {
            if ((((*(byte *)((long)&conn->proto + 0x112) & 2) == 0) && (0 < lVar5)) &&
               (uVar11 = uVar12, (data->req).bytecount == 0)) {
              Curl_failf(data,"No data was received");
              uVar11 = 0x13;
            }
          }
          else {
            Curl_failf(data,"Received only partial file: %ld bytes");
LAB_001284bb:
            uVar11 = 0x12;
          }
        }
        else {
          lVar5 = (data->state).infilesize;
          uVar11 = uVar12;
          if ((((lVar5 != -1) && (lVar5 != (data->req).writebytecount)) &&
              (((data->set).field_0x8ca & 0x20) == 0)) && (pFVar3->fd == 0)) {
            Curl_failf(data,"Uploaded unaligned file size (%ld out of %ld bytes)");
            goto LAB_001284bb;
          }
        }
      }
    }
  }
  else {
LAB_00127f91:
    pbVar1 = (byte *)((long)&conn->proto + 0x112);
    *pbVar1 = *pbVar1 & 0xfb;
    Curl_conncontrol(conn,1);
    (*Curl_cfree)((conn->proto).ftpc.prevpath);
    (conn->proto).ftpc.prevpath = (char *)0x0;
    freedirs(&ftpc->ftpc);
    if (conn->sock[1] != -1) {
LAB_00127fd3:
      close_secondarysocket(data);
    }
  }
  pFVar3->fd = 0;
  pbVar1 = (byte *)((long)&conn->proto + 0x112);
  *pbVar1 = *pbVar1 & 0xfd;
  if ((status == CURLE_OK && (int)uVar11 == 0) && !premature) {
    pcVar13 = (data->set).postquote;
    if (pcVar13 == (curl_slist *)0x0) {
      uVar11 = 0;
    }
    else {
      do {
        pcVar10 = pcVar13->data;
        if (pcVar10 != (char *)0x0) {
          local_54 = 0;
          cVar2 = *pcVar10;
          CVar8 = Curl_pp_sendf(data,&(ftpc->ftpc).pp,"%s",pcVar10 + (cVar2 == '*'));
          if (CVar8 == CURLE_OK) {
            cVar14 = Curl_now();
            (conn->proto).ftpc.pp.response.tv_sec = cVar14.tv_sec;
            (conn->proto).rtspc.state = cVar14.tv_usec;
            CVar8 = Curl_GetFTPResponse(data,&local_38,&local_54);
            if (CVar8 == CURLE_OK) {
              if ((cVar2 == '*') || (local_54 < 400)) goto LAB_00128089;
              Curl_failf(data,"QUOT string not accepted: %s",pcVar10);
              uVar11 = 0x15;
              goto LAB_0012813a;
            }
          }
          uVar11 = (ulong)CVar8;
          goto LAB_0012813a;
        }
LAB_00128089:
        pcVar13 = pcVar13->next;
      } while (pcVar13 != (curl_slist *)0x0);
      uVar11 = 0;
LAB_0012813a:
      CVar8 = (CURLcode)uVar11;
      if (data == (Curl_easy *)0x0) goto LAB_0012819f;
    }
  }
  CVar8 = (CURLcode)uVar11;
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
      (0 < Curl_trc_feat_ftp.log_level)))) {
    if (data->conn == (connectdata *)0x0) {
      pcVar10 = "???";
    }
    else {
      pcVar10 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] done, result=%d",pcVar10,uVar11);
  }
LAB_0012819f:
  (*Curl_cfree)(pFVar3->freepath);
  pFVar3->freepath = (char *)0x0;
  return CVar8;
}

Assistant:

static CURLcode ftp_done(struct Curl_easy *data, CURLcode status,
                         bool premature)
{
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL;
  size_t pathLen = 0;

  if(!ftp)
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
  case CURLE_OK: /* does not affect the control connection's status */
    if(!premature)
      break;

    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
    FALLTHROUGH();
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  if(data->state.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      Curl_set_in_callback(data, TRUE);
      data->set.chunk_end(data->set.wildcardptr);
      Curl_set_in_callback(data, FALSE);
    }
    ftpc->known_filesize = -1;
  }

  if(!result)
    /* get the url-decoded "raw" path */
    result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen,
                            REJECT_CTRL);
  if(result) {
    /* We can limp along anyway (and should try to since we may already be in
     * the error path) */
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    free(ftpc->prevpath);
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else { /* remember working directory for connection reuse */
    if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
      free(rawPath); /* full path => no CWDs happened => keep ftpc->prevpath */
    else {
      free(ftpc->prevpath);

      if(!ftpc->cwdfail) {
        if(data->set.ftp_filemethod == FTPFILE_NOCWD)
          pathLen = 0; /* relative path => working directory is FTP home */
        else
          /* file is url-decoded */
          pathLen -= ftpc->file ? strlen(ftpc->file) : 0;

        rawPath[pathLen] = '\0';
        ftpc->prevpath = rawPath;
      }
      else {
        free(rawPath);
        ftpc->prevpath = NULL; /* no path */
      }
    }

    if(ftpc->prevpath)
      infof(data, "Remembering we are in dir \"%s\"", ftpc->prevpath);
  }

  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we are done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET], 2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(data, pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    close_secondarysocket(data);
  }

  if(!result && (ftp->transfer == PPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    timediff_t old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_now(); /* timeout relative now */

    result = Curl_GetFTPResponse(data, &nread, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result) {
      Curl_safefree(ftp->pathalloc);
      return result;
    }

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      switch(ftpcode) {
      case 226:
      case 250:
        break;
      case 552:
        failf(data, "Exceeded storage allocation");
        result = CURLE_REMOTE_DISK_FULL;
        break;
      default:
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
        break;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->state.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != data->req.writebytecount) &&
       !data->set.crlf &&
       (ftp->transfer == PPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" FMT_OFF_T
            " out of %" FMT_OFF_T " bytes)",
            data->req.writebytecount, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != data->req.bytecount) &&
       (data->req.maxdownload != data->req.bytecount)) {
      failf(data, "Received only partial file: %" FMT_OFF_T " bytes",
            data->req.bytecount);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !data->req.bytecount &&
            (data->req.size > 0)) {
      failf(data, "No data was received");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = PPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(data, conn, data->set.postquote);
  CURL_TRC_FTP(data, "[%s] done, result=%d", FTP_DSTATE(data), result);
  Curl_safefree(ftp->pathalloc);
  return result;
}